

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

QByteArray *
QUtf32::convertFromUnicode
          (QByteArray *__return_storage_ptr__,QStringView in,State *state,DataEndianness endian)

{
  Data *pDVar1;
  char *pcVar2;
  char *pcVar3;
  long size;
  DataEndianness in_R9D;
  QStringView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  pcVar3 = (char *)in.m_size;
  if ((state->internalState & 1) == 0) {
    size = (ulong)((state->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                   super_QFlagsStorage<QStringConverterBase::Flag>.i & 4) + (long)pcVar3 * 4;
  }
  else {
    size = (long)pcVar3 * 4;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  pDVar1 = (__return_storage_ptr__->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
  in_00.m_data = (storage_type_conflict *)state;
  pcVar2 = convertFromUnicode((QUtf32 *)(__return_storage_ptr__->d).ptr,pcVar3,in_00,
                              (State *)(ulong)endian,in_R9D);
  pcVar3 = (__return_storage_ptr__->d).ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &QByteArray::_empty;
  }
  QByteArray::truncate(__return_storage_ptr__,pcVar2 + -(long)pcVar3,__length);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf32::convertFromUnicode(QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;
    qsizetype length =  4*in.size();
    if (writeBom)
        length += 4;
    QByteArray ba(length, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state, endian);
    ba.truncate(end - ba.constData());
    return ba;
}